

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O3

void __thiscall
Fossilize::CLIParser::CLIParser(CLIParser *this,CLICallbacks *cbs_,int argc_,char **argv_)

{
  undefined8 uVar1;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this,cbs_,cbs_);
  *(undefined8 *)&(this->cbs).error_handler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->cbs).error_handler.super__Function_base._M_functor + 8) = 0;
  (this->cbs).error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->cbs).error_handler._M_invoker = (cbs_->error_handler)._M_invoker;
  if ((cbs_->error_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(cbs_->error_handler).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->cbs).error_handler.super__Function_base._M_functor =
         *(undefined8 *)&(cbs_->error_handler).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->cbs).error_handler.super__Function_base._M_functor + 8) = uVar1;
    (this->cbs).error_handler.super__Function_base._M_manager =
         (cbs_->error_handler).super__Function_base._M_manager;
    (cbs_->error_handler).super__Function_base._M_manager = (_Manager_type)0x0;
    (cbs_->error_handler)._M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->cbs).default_handler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->cbs).default_handler.super__Function_base._M_functor + 8) = 0;
  (this->cbs).default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->cbs).default_handler._M_invoker = (cbs_->default_handler)._M_invoker;
  if ((cbs_->default_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(cbs_->default_handler).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->cbs).default_handler.super__Function_base._M_functor =
         *(undefined8 *)&(cbs_->default_handler).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->cbs).default_handler.super__Function_base._M_functor + 8) = uVar1;
    (this->cbs).default_handler.super__Function_base._M_manager =
         (cbs_->default_handler).super__Function_base._M_manager;
    (cbs_->default_handler).super__Function_base._M_manager = (_Manager_type)0x0;
    (cbs_->default_handler)._M_invoker = (_Invoker_type)0x0;
  }
  this->argc = argc_;
  this->argv = argv_;
  this->ended_state = false;
  this->unknown_argument_is_default = false;
  return;
}

Assistant:

CLIParser::CLIParser(CLICallbacks cbs_, int argc_, char *argv_[])
	: cbs(move(cbs_)), argc(argc_), argv(argv_)
{
}